

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_correct_elem_ns(ly_ctx *ctx,lyxml_elem *elem,int copy_ns,int correct_attrs)

{
  lyxml_ns *plVar1;
  lyxml_attr *plVar2;
  lyxml_attr *local_50;
  lyxml_attr *attr;
  lyxml_elem *iter;
  lyxml_elem *tmp;
  lyxml_elem *ns_root;
  lyxml_elem *elem_root;
  lyxml_ns *tmp_ns;
  int correct_attrs_local;
  int copy_ns_local;
  lyxml_elem *elem_local;
  ly_ctx *ctx_local;
  
  for (ns_root = elem; attr = (lyxml_attr *)elem, ns_root->parent != (lyxml_elem *)0x0;
      ns_root = ns_root->parent) {
  }
  do {
    if (attr == (lyxml_attr *)0x0) {
      return;
    }
    if (attr[1].ns != (lyxml_ns *)0x0) {
      for (tmp = (attr[1].ns)->parent; tmp != (lyxml_elem *)0x0; tmp = tmp->parent) {
      }
      if (ns_root != (lyxml_elem *)0x0) {
        if (copy_ns == 0) {
          attr[1].ns = (lyxml_ns *)0x0;
        }
        else {
          plVar2 = (lyxml_attr *)attr[1].ns;
          plVar1 = lyxml_get_ns((lyxml_elem *)attr,plVar2->name);
          attr[1].ns = plVar1;
          if (attr[1].ns == (lyxml_ns *)0x0) {
            plVar2 = lyxml_dup_attr(ctx,(lyxml_elem *)attr,plVar2);
            attr[1].ns = (lyxml_ns *)plVar2;
          }
        }
      }
    }
    if (correct_attrs != 0) {
      for (local_50 = (lyxml_attr *)attr->ns; local_50 != (lyxml_attr *)0x0;
          local_50 = local_50->next) {
        lyxml_correct_attr_ns(ctx,local_50,ns_root,copy_ns);
      }
    }
    iter = (lyxml_elem *)attr->name;
    if (iter == (lyxml_elem *)0x0) {
      if ((lyxml_elem *)attr == elem) {
        return;
      }
      iter = (lyxml_elem *)attr->value;
    }
    while ((iter == (lyxml_elem *)0x0 &&
           (attr = attr->next, (lyxml_elem *)attr->next != elem->parent))) {
      iter = (lyxml_elem *)attr->value;
    }
    attr = (lyxml_attr *)iter;
  } while( true );
}

Assistant:

void
lyxml_correct_elem_ns(struct ly_ctx *ctx, struct lyxml_elem *elem, int copy_ns, int correct_attrs)
{
    const struct lyxml_ns *tmp_ns;
    struct lyxml_elem *elem_root, *ns_root, *tmp, *iter;
    struct lyxml_attr *attr;

    /* find the root of elem */
    for (elem_root = elem; elem_root->parent; elem_root = elem_root->parent);

    LY_TREE_DFS_BEGIN(elem, tmp, iter) {
        if (iter->ns) {
            /* find the root of elem NS */
            for (ns_root = iter->ns->parent; ns_root; ns_root = ns_root->parent);

            /* elem NS is defined outside elem subtree */
            if (ns_root != elem_root) {
                if (copy_ns) {
                    tmp_ns = iter->ns;
                    /* we may have already copied the NS over? */
                    iter->ns = lyxml_get_ns(iter, tmp_ns->prefix);

                    /* we haven't copied it over, copy it now */
                    if (!iter->ns) {
                        iter->ns = (struct lyxml_ns *)lyxml_dup_attr(ctx, iter, (struct lyxml_attr *)tmp_ns);
                    }
                } else {
                    iter->ns = NULL;
                }
            }
        }
        if (correct_attrs) {
            LY_TREE_FOR(iter->attr, attr) {
                lyxml_correct_attr_ns(ctx, attr, elem_root, copy_ns);
            }
        }
        LY_TREE_DFS_END(elem, tmp, iter);
    }
}